

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VGetVectorID(N_Vector X,N_Vector_ID ID,int myid)

{
  N_Vector_ID NVar1;
  int iVar2;
  
  NVar1 = N_VGetVectorID(X);
  if (NVar1 == ID) {
    iVar2 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VGetVectorID ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n",(ulong)(uint)myid);
    NVar1 = N_VGetVectorID(X);
    printf("    Unrecognized vector type %d \n \n",(ulong)NVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Test_N_VGetVectorID(N_Vector X, N_Vector_ID ID, int myid)
{
  if (N_VGetVectorID(X) != ID) {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n", myid);
    printf("    Unrecognized vector type %d \n \n", N_VGetVectorID(X));
    return (1);
  } else if (myid == 0) {
    printf("PASSED test -- N_VGetVectorID \n");
  }
  return (0);
}